

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerBailOnNotBuiltIn
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *labelBailOut)

{
  Instr *pIVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  IntConstOpnd *this_00;
  MemRefOpnd *compareSrc2;
  LabelInstr *target;
  Opnd *compareSrc1;
  Lowerer *this_01;
  
  OVar3 = IR::Opnd::GetKind(instr->m_src2);
  if (OVar3 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3218,"(instr->GetSrc2()->IsIntConstOpnd())",
                       "instr->GetSrc2()->IsIntConstOpnd()");
    if (!bVar4) goto LAB_005bbadc;
    *puVar7 = 0;
  }
  pIVar1 = instr->m_prev;
  iVar5 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x1f])();
  this_00 = (IntConstOpnd *)IR::Instr::UnlinkSrc2(instr);
  OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar3 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar4) goto LAB_005bbadc;
    *puVar7 = 0;
  }
  uVar6 = IR::IntConstOpnd::AsInt32(this_00);
  if (0xff < uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/RuntimeCommon.h"
                       ,0x93,"(((int) _value) == n)","Ensure no truncation");
    if (!bVar4) {
LAB_005bbadc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  compareSrc2 = IR::MemRefOpnd::New((void *)(CONCAT44(extraout_var,iVar5) +
                                            (ulong)(uVar6 & 0xff) * 8),TyInt64,instr->m_func,
                                    AddrOpndKindDynamicMisc);
  target = IR::LabelInstr::New(Label,instr->m_func,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  this_01 = (Lowerer *)instr;
  compareSrc1 = IR::Instr::UnlinkSrc1(instr);
  InsertCompareBranch(this_01,compareSrc1,&compareSrc2->super_Opnd,BrEq_A,false,target,instr,false);
  GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnNotBuiltIn(IR::Instr       *instr,
                               IR::BranchInstr *branchInstr  /* = nullptr */,
                               IR::LabelInstr  *labelBailOut /* = nullptr */)
{
    Assert(instr->GetSrc2()->IsIntConstOpnd());
    IR::Instr *prevInstr = instr->m_prev;

    intptr_t builtInFuncs = m_func->GetScriptContextInfo()->GetBuiltinFunctionsBaseAddr();
    Js::BuiltinFunction builtInIndex = instr->UnlinkSrc2()->AsIntConstOpnd()->AsInt32();

    IR::Opnd *builtIn = IR::MemRefOpnd::New((void*)(builtInFuncs + builtInIndex * MachPtr), TyMachReg, instr->m_func);

#if TESTBUILTINFORNULL
    IR::LabelInstr * continueAfterTestLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    InsertTestBranch(builtIn, builtIn, Js::OpCode::BrNeq_A, continueAfterTestLabel, instr);
    this->m_lowererMD.GenerateDebugBreak(instr);
    instr->InsertBefore(continueAfterTestLabel);
#endif

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
    instr->InsertAfter(continueLabel);
    InsertCompareBranch(instr->UnlinkSrc1(), builtIn, Js::OpCode::BrEq_A, continueLabel, instr);

    GenerateBailOut(instr, branchInstr, labelBailOut);

    return prevInstr;
}